

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

cJSON_bool parse_value(cJSON *item,parse_buffer *input_buffer)

{
  uchar uVar1;
  uchar *puVar2;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  int iVar6;
  cJSON_bool cVar7;
  ulong uVar8;
  cJSON *pcVar9;
  cJSON *pcVar10;
  long lVar11;
  cJSON *item_00;
  cJSON *pcVar12;
  byte bVar13;
  uint uVar14;
  double dVar15;
  uchar *after_end;
  byte local_78 [72];
  
  if (input_buffer == (parse_buffer *)0x0) {
    return 0;
  }
  puVar2 = input_buffer->content;
  if (puVar2 == (uchar *)0x0) {
    return 0;
  }
  uVar3 = input_buffer->length;
  uVar4 = input_buffer->offset;
  uVar8 = uVar4 + 4;
  if ((uVar8 <= uVar3) && (iVar6 = strncmp((char *)(puVar2 + uVar4),"null",4), iVar6 == 0)) {
    item->type = 4;
    input_buffer->offset = uVar8;
    return 1;
  }
  if ((uVar4 + 5 <= uVar3) && (iVar6 = strncmp((char *)(puVar2 + uVar4),"false",5), iVar6 == 0)) {
    item->type = 1;
    input_buffer->offset = uVar4 + 5;
    return 1;
  }
  if ((uVar8 <= uVar3) && (iVar6 = strncmp((char *)(puVar2 + uVar4),"true",4), iVar6 == 0)) {
    item->type = 2;
    item->valueint = 1;
    input_buffer->offset = uVar8;
    return 1;
  }
  if (uVar3 <= uVar4) {
    return 0;
  }
  uVar1 = puVar2[uVar4];
  if (uVar1 == '\"') {
    cVar7 = parse_string(item,input_buffer);
    return cVar7;
  }
  if (uVar1 == '-' || (byte)(uVar1 - 0x30) < 10) {
    after_end = (uchar *)0x0;
    bVar5 = get_decimal_point();
    puVar2 = input_buffer->content;
    if (puVar2 == (uchar *)0x0) {
      return 0;
    }
    for (lVar11 = 0; (lVar11 != 0x3f && (lVar11 + input_buffer->offset < input_buffer->length));
        lVar11 = lVar11 + 1) {
      bVar13 = puVar2[lVar11 + input_buffer->offset];
      uVar14 = bVar13 - 0x2b;
      if ((0x3a < uVar14) ||
         (((0x400000004007fe5U >> ((ulong)uVar14 & 0x3f) & 1) == 0 &&
          (bVar13 = bVar5, (ulong)uVar14 != 3)))) break;
      local_78[lVar11] = bVar13;
    }
    local_78[lVar11] = 0;
    dVar15 = strtod((char *)local_78,(char **)&after_end);
    if (local_78 == after_end) {
      return 0;
    }
    item->valuedouble = dVar15;
    iVar6 = 0x7fffffff;
    if ((dVar15 < 2147483647.0) && (iVar6 = -0x80000000, -2147483648.0 < dVar15)) {
      iVar6 = (int)dVar15;
    }
    item->valueint = iVar6;
    item->type = 8;
    input_buffer->offset = (size_t)(after_end + (input_buffer->offset - (long)local_78));
    return 1;
  }
  if (uVar1 == '{') {
    if (999 < input_buffer->depth) {
      return 0;
    }
    input_buffer->depth = input_buffer->depth + 1;
    if (puVar2[uVar4] != '{') {
      return 0;
    }
    input_buffer->offset = uVar4 + 1;
    buffer_skip_whitespace(input_buffer);
    uVar8 = input_buffer->offset;
    if (uVar8 < input_buffer->length) {
      if (input_buffer->content[uVar8] == '}') {
        item_00 = (cJSON *)0x0;
      }
      else {
        input_buffer->offset = uVar8 - 1;
        pcVar12 = (cJSON *)0x0;
        pcVar9 = (cJSON *)0x0;
        do {
          pcVar10 = (cJSON *)(*(input_buffer->hooks).allocate)(0x40);
          item_00 = pcVar12;
          if (pcVar10 == (cJSON *)0x0) goto joined_r0x00101ae4;
          pcVar10->valuedouble = 0.0;
          pcVar10->string = (char *)0x0;
          pcVar10->valuestring = (char *)0x0;
          *(undefined8 *)&pcVar10->valueint = 0;
          pcVar10->child = (cJSON *)0x0;
          *(undefined8 *)&pcVar10->type = 0;
          pcVar10->next = (cJSON *)0x0;
          pcVar10->prev = (cJSON *)0x0;
          item_00 = pcVar10;
          if (pcVar12 != (cJSON *)0x0) {
            pcVar9->next = pcVar10;
            pcVar10->prev = pcVar9;
            item_00 = pcVar12;
          }
          input_buffer->offset = input_buffer->offset + 1;
          buffer_skip_whitespace(input_buffer);
          cVar7 = parse_string(pcVar10,input_buffer);
          if (cVar7 == 0) goto LAB_00101ac4;
          buffer_skip_whitespace(input_buffer);
          pcVar10->string = pcVar10->valuestring;
          pcVar10->valuestring = (char *)0x0;
          uVar8 = input_buffer->offset;
          if ((input_buffer->length <= uVar8) || (input_buffer->content[uVar8] != ':'))
          goto LAB_00101ac4;
          input_buffer->offset = uVar8 + 1;
          buffer_skip_whitespace(input_buffer);
          cVar7 = parse_value(pcVar10,input_buffer);
          if (cVar7 == 0) goto LAB_00101ac4;
          buffer_skip_whitespace(input_buffer);
          uVar8 = input_buffer->offset;
          if (input_buffer->length <= uVar8) goto LAB_00101ac4;
          pcVar12 = item_00;
          pcVar9 = pcVar10;
        } while (input_buffer->content[uVar8] == ',');
        if (input_buffer->content[uVar8] != '}') goto LAB_00101ac4;
      }
      input_buffer->depth = input_buffer->depth - 1;
      item->type = 0x40;
      item->child = item_00;
      goto LAB_00101913;
    }
  }
  else {
    if (uVar1 != '[') {
      return 0;
    }
    if (999 < input_buffer->depth) {
      return 0;
    }
    input_buffer->depth = input_buffer->depth + 1;
    if (puVar2[uVar4] != '[') {
      return 0;
    }
    input_buffer->offset = uVar4 + 1;
    buffer_skip_whitespace(input_buffer);
    uVar8 = input_buffer->offset;
    if (uVar8 < input_buffer->length) {
      if (input_buffer->content[uVar8] == ']') {
        item_00 = (cJSON *)0x0;
      }
      else {
        input_buffer->offset = uVar8 - 1;
        item_00 = (cJSON *)0x0;
        pcVar12 = (cJSON *)0x0;
        do {
          pcVar9 = (cJSON *)(*(input_buffer->hooks).allocate)(0x40);
          if (pcVar9 == (cJSON *)0x0) goto joined_r0x00101ae4;
          pcVar9->valuedouble = 0.0;
          pcVar9->string = (char *)0x0;
          pcVar9->valuestring = (char *)0x0;
          *(undefined8 *)&pcVar9->valueint = 0;
          pcVar9->child = (cJSON *)0x0;
          *(undefined8 *)&pcVar9->type = 0;
          pcVar9->next = (cJSON *)0x0;
          pcVar9->prev = (cJSON *)0x0;
          pcVar10 = pcVar9;
          if (item_00 != (cJSON *)0x0) {
            pcVar12->next = pcVar9;
            pcVar9->prev = pcVar12;
            pcVar10 = item_00;
          }
          item_00 = pcVar10;
          input_buffer->offset = input_buffer->offset + 1;
          buffer_skip_whitespace(input_buffer);
          cVar7 = parse_value(pcVar9,input_buffer);
          if (cVar7 == 0) goto LAB_00101ac4;
          buffer_skip_whitespace(input_buffer);
          uVar8 = input_buffer->offset;
          if (input_buffer->length <= uVar8) goto LAB_00101ac4;
          pcVar12 = pcVar9;
        } while (input_buffer->content[uVar8] == ',');
        if (input_buffer->content[uVar8] != ']') goto LAB_00101ac4;
      }
      input_buffer->depth = input_buffer->depth - 1;
      item->type = 0x20;
      item->child = item_00;
LAB_00101913:
      input_buffer->offset = uVar8 + 1;
      return 1;
    }
  }
  input_buffer->offset = uVar8 - 1;
  return 0;
joined_r0x00101ae4:
  if (item_00 == (cJSON *)0x0) {
    return 0;
  }
LAB_00101ac4:
  cJSON_Delete(item_00);
  return 0;
}

Assistant:

static cJSON_bool parse_value(cJSON * const item, parse_buffer * const input_buffer)
{
    if ((input_buffer == NULL) || (input_buffer->content == NULL))
    {
        return false; /* no input */
    }

    /* parse the different types of values */
    /* null */
    if (can_read(input_buffer, 4) && (strncmp((const char*)buffer_at_offset(input_buffer), "null", 4) == 0))
    {
        item->type = cJSON_NULL;
        input_buffer->offset += 4;
        return true;
    }
    /* false */
    if (can_read(input_buffer, 5) && (strncmp((const char*)buffer_at_offset(input_buffer), "false", 5) == 0))
    {
        item->type = cJSON_False;
        input_buffer->offset += 5;
        return true;
    }
    /* true */
    if (can_read(input_buffer, 4) && (strncmp((const char*)buffer_at_offset(input_buffer), "true", 4) == 0))
    {
        item->type = cJSON_True;
        item->valueint = 1;
        input_buffer->offset += 4;
        return true;
    }
    /* string */
    if (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == '\"'))
    {
        return parse_string(item, input_buffer);
    }
    /* number */
    if (can_access_at_index(input_buffer, 0) && ((buffer_at_offset(input_buffer)[0] == '-') || ((buffer_at_offset(input_buffer)[0] >= '0') && (buffer_at_offset(input_buffer)[0] <= '9'))))
    {
        return parse_number(item, input_buffer);
    }
    /* array */
    if (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == '['))
    {
        return parse_array(item, input_buffer);
    }
    /* object */
    if (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == '{'))
    {
        return parse_object(item, input_buffer);
    }


    return false;
}